

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O2

void __thiscall
dynet::PickRange::backward_dev_impl<dynet::Device_CPU>
          (PickRange *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  DSizes<long,_5> sizes;
  ulong local_148 [6];
  DefaultDevice *local_118;
  StoragePointerType *local_110;
  TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer> local_108;
  TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer> local_d8;
  StoragePointerType local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  ulong local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  long local_50;
  long lStack_48;
  long local_40;
  long lStack_38;
  long local_30;
  
  local_148[2] = 0;
  local_148[3] = 0;
  local_148[4] = 0;
  local_148[0] = 0;
  local_148[1] = 0;
  uVar1 = this->start;
  uVar2 = this->dim;
  local_148[uVar2] = (ulong)uVar1;
  uVar3 = (fx->d).nd;
  sizes.super_array<long,_5>._M_elems[3] = 1;
  uVar4 = 1;
  uVar5 = uVar4;
  uVar6 = uVar4;
  if ((uVar3 != 0) && (uVar5 = (fx->d).d[0], uVar3 != 1)) {
    uVar6 = (fx->d).d[1];
    if ((2 < uVar3) && (uVar4 = (fx->d).d[2], uVar3 != 3)) {
      sizes.super_array<long,_5>._M_elems[3] = (long)(fx->d).d[3];
    }
  }
  sizes.super_array<long,_5>._M_elems[1] = (long)uVar6;
  sizes.super_array<long,_5>._M_elems[0] = (long)uVar5;
  sizes.super_array<long,_5>._M_elems[2] = (long)uVar4;
  sizes.super_array<long,_5>._M_elems[4] = (long)(fx->d).bd;
  sizes.super_array<long,_5>._M_elems[uVar2] = (ulong)(this->end - uVar1);
  Tensor::tb<4>(&local_d8,dEdf);
  Tensor::tb<4>(&local_108,dEdxi);
  local_110 = &local_a8;
  local_88 = local_108.m_dimensions.super_array<long,_5>._M_elems[3];
  lStack_80 = local_108.m_dimensions.super_array<long,_5>._M_elems[4];
  local_98 = local_108.m_dimensions.super_array<long,_5>._M_elems[1];
  lStack_90 = local_108.m_dimensions.super_array<long,_5>._M_elems[2];
  local_a8 = local_108.m_data;
  lStack_a0 = local_108.m_dimensions.super_array<long,_5>._M_elems[0];
  local_58 = local_148[4];
  local_68 = local_148[2];
  uStack_60 = local_148[3];
  local_78 = local_148[0];
  uStack_70 = local_148[1];
  local_50 = sizes.super_array<long,_5>._M_elems[0];
  lStack_48 = sizes.super_array<long,_5>._M_elems[1];
  local_40 = sizes.super_array<long,_5>._M_elems[2];
  lStack_38 = sizes.super_array<long,_5>._M_elems[3];
  local_30 = sizes.super_array<long,_5>._M_elems[4];
  local_118 = dev->edevice;
  Eigen::
  TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,5>const,Eigen::DSizes<long,5>const,Eigen::TensorMap<Eigen::Tensor<float,5,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
  ::operator+=((TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,5>const,Eigen::DSizes<long,5>const,Eigen::TensorMap<Eigen::Tensor<float,5,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                *)&local_118,&local_d8);
  return;
}

Assistant:

void PickRange::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  Eigen::DSizes<ptrdiff_t, 5> indices(0,0,0,0,0);
  indices[dim] = start;
  Eigen::DSizes<ptrdiff_t, 5> sizes(static_cast<ptrdiff_t>(fx.d[0]), 
                                    static_cast<ptrdiff_t>(fx.d[1]),
                                    static_cast<ptrdiff_t>(fx.d[2]),
                                    static_cast<ptrdiff_t>(fx.d[3]),
                                    static_cast<ptrdiff_t>(fx.d.bd));
  sizes[dim] = end-start;
  dEdxi.tb<4>().slice(indices, sizes).device(*dev.edevice) += dEdf.tb<4>();
}